

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tiled_Image.cxx
# Opt level: O1

int __thiscall Fl_Tiled_Image::copy(Fl_Tiled_Image *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Fl_Image *pFVar1;
  Fl_Tiled_Image *this_00;
  
  if (((this->super_Fl_Image).w_ != (int)dst) || ((this->super_Fl_Image).h_ != (int)src)) {
    this_00 = (Fl_Tiled_Image *)operator_new(0x38);
    pFVar1 = this->image_;
    Fl_Image::Fl_Image((Fl_Image *)this_00,(int)dst,(int)src,0);
    (this_00->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_Tiled_Image_0027b9a0;
    this_00->image_ = pFVar1;
    this_00->alloc_image_ = 0;
    this = this_00;
  }
  return (int)this;
}

Assistant:

Fl_Image *			// O - New image
Fl_Tiled_Image::copy(int W,	// I - New width
                     int H) {	// I - New height
  if (W == w() && H == h()) return this;
  else return new Fl_Tiled_Image(image_, W, H);
}